

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void print_statistics(int cur_k)

{
  int iVar1;
  Logger *this;
  long lVar2;
  __node_base *p_Var3;
  long lVar4;
  long lVar5;
  size_type sVar6;
  
  if (statistics != 0) {
    Logger::info(logger,"total_nodes: %ld",Node::nodes._M_h._M_element_count);
    if (statistics == 2) {
      lVar2 = count_edges();
      p_Var3 = &Node::nodes._M_h._M_before_begin;
      lVar4 = 0;
      sVar6 = Node::nodes._M_h._M_element_count;
      do {
        p_Var3 = p_Var3->_M_nxt;
        if (p_Var3 == (__node_base *)0x0) {
LAB_00102d0c:
          lVar5 = (lVar2 + sVar6) - Node::nodes._M_h._M_element_count;
          Logger::debugl2(logger,"total_edges: %ld",lVar2);
          Logger::debug(logger,"total_nodes (expanded): %ld",sVar6);
          Logger::debugl2(logger,"total_edges (expanded): %ld",lVar5);
          this = logger;
          lVar2 = count_deadends();
          Logger::debugl2(this,"total_deadends: %ld",lVar2);
          Logger::debug(logger,"total_letters: %ld",lVar4);
          return;
        }
        iVar1 = (int)*(size_t *)(p_Var3 + 3);
        if (iVar1 < cur_k) {
          Logger::fatal(logger,"ERROR in cur_k during statistics!");
          goto LAB_00102d0c;
        }
        sVar6 = sVar6 + (long)(iVar1 - cur_k);
        lVar4 = lVar4 + iVar1;
      } while( true );
    }
  }
  return;
}

Assistant:

void print_statistics(int cur_k) {
    if (statistics == 0)
        return;
    logger->info("total_nodes: %ld", Node::nodes.size());
    if (statistics == 2) {
        long total_edges = count_edges();
        long total_not_unified_nodes = Node::nodes.size();
        long total_letters = 0;
        for (auto &node: Node::nodes) {
            if (node.second.sequence_len < cur_k) {
                logger->fatal("ERROR in cur_k during statistics!");
                break;
            }
            total_not_unified_nodes += node.second.sequence_len - cur_k;
            total_letters += node.second.sequence_len;
        }
        long total_not_unified_edges = total_edges + total_not_unified_nodes;
        total_not_unified_edges -= Node::nodes.size();
        logger->debugl2("total_edges: %ld", total_edges);
        logger->debug("total_nodes (expanded): %ld", total_not_unified_nodes);
        logger->debugl2("total_edges (expanded): %ld", total_not_unified_edges);
        logger->debugl2("total_deadends: %ld", count_deadends());
        logger->debug("total_letters: %ld", total_letters);
    }
}